

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O3

void __thiscall
Js::SimpleDictionaryTypeHandlerBase<int,Js::JavascriptString*,false>::Add<Js::PropertyRecord_const*>
          (SimpleDictionaryTypeHandlerBase<int,Js::JavascriptString*,false> *this,int propertyIndex,
          PropertyRecord *propertyKey,PropertyAttributes attributes,bool isInitialized,bool isFixed,
          bool usedAsFixed,ScriptContext *scriptContext)

{
  Type *pTVar1;
  BaseDictionary<Js::JavascriptString*,Js::SimpleDictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::JavascriptString*>::Entry,JsUtil::NoResizeLock>
  *this_00;
  code *pcVar2;
  PrototypeChainCache<Js::NoSpecialPropertyCache> *pPVar3;
  bool bVar4;
  PropertyId propertyId;
  undefined4 *puVar5;
  undefined7 in_register_00000009;
  Type *pTVar6;
  SimpleDictionaryPropertyDescriptor<int> local_58;
  JavascriptLibrary *local_50;
  uint local_44;
  PrototypeChainCache<Js::NoSpecialPropertyCache> *local_40;
  DynamicTypeHandler *local_38;
  
  if (propertyKey != (PropertyRecord *)0x0) {
    local_50 = (scriptContext->super_ScriptContextBase).javascriptLibrary;
    local_44 = (uint)CONCAT71(in_register_00000009,attributes);
    local_58.Attributes = attributes;
    local_58.propertyIndex = propertyIndex;
    if ((isFixed || usedAsFixed) &&
       (((uint)propertyKey->pid < 0x10 || (*(long *)(this + 0x20) == 0)))) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      local_38 = (DynamicTypeHandler *)__tls_get_addr(&PTR_01548f08);
      *(undefined4 *)&local_38->_vptr_DynamicTypeHandler = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                  ,0x41c,
                                  "((!isFixed && !usedAsFixed) || (!TPropertyKey_IsInternalPropertyId(propertyKey) && this->singletonInstance != nullptr))"
                                  ,
                                  "(!isFixed && !usedAsFixed) || (!TPropertyKey_IsInternalPropertyId(propertyKey) && this->singletonInstance != nullptr)"
                                 );
      if (!bVar4) goto LAB_00e32db6;
      *(undefined4 *)&local_38->_vptr_DynamicTypeHandler = 0;
    }
    if (((uint)propertyKey->pid < 0x10) || (propertyKey->isSymbol == true)) {
      AssertCount = AssertCount + 1;
      local_38 = (DynamicTypeHandler *)this;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                  ,0x41f,"(!TMapKey_IsJavascriptString<TMapKey>())",
                                  "!TMapKey_IsJavascriptString<TMapKey>()");
      if (!bVar4) {
LAB_00e32db6:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar5 = 0;
      *(byte *)&local_38[1].unusedBytes = (byte)local_38[1].unusedBytes | 4;
      this = (SimpleDictionaryTypeHandlerBase<int,Js::JavascriptString*,false> *)local_38;
    }
    local_58._0_1_ = (usedAsFixed << 3 | isFixed << 2 | isInitialized * '\x02') + 1;
    this_00 = (BaseDictionary<Js::JavascriptString*,Js::SimpleDictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::JavascriptString*>::Entry,JsUtil::NoResizeLock>
               *)((DynamicTypeHandler *)((long)this + 0x18))->_vptr_DynamicTypeHandler;
    local_40 = (PrototypeChainCache<Js::NoSpecialPropertyCache> *)
               TMapKey_ConvertKey<Js::JavascriptString*>(scriptContext,propertyKey);
    JsUtil::
    BaseDictionary<Js::JavascriptString*,Js::SimpleDictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::JavascriptString*>::Entry,JsUtil::NoResizeLock>
    ::
    Insert<(JsUtil::BaseDictionary<Js::JavascriptString*,Js::SimpleDictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::JavascriptString*>::Entry,JsUtil::NoResizeLock>::InsertOperations)0>
              (this_00,(JavascriptString **)&local_40,&local_58);
    pTVar1 = &local_50->typesWithNoSpecialPropertyProtoChain;
    Memory::Recycler::WBSetBit((char *)&local_40);
    local_40 = pTVar1;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_40);
    pPVar3 = local_40;
    bVar4 = NoSpecialPropertyCache::IsSpecialProperty(propertyKey);
    if ((bVar4) &&
       (((DynamicTypeHandler *)this)->propertyTypes =
             ((DynamicTypeHandler *)this)->propertyTypes | 0x80,
       (((DynamicTypeHandler *)this)->flags & 0x20) != 0)) {
      PrototypeChainCache<Js::NoSpecialPropertyCache>::Clear(pPVar3);
    }
    pTVar6 = &local_50->typesWithOnlyWritablePropertyProtoChain;
    Memory::Recycler::WBSetBit((char *)&local_40);
    local_40 = (PrototypeChainCache<Js::NoSpecialPropertyCache> *)pTVar6;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_40);
    pPVar3 = local_40;
    if ((local_44 & 4) == 0) {
      DynamicTypeHandler::SetHasOnlyWritableDataProperties((DynamicTypeHandler *)this,false);
      if ((((DynamicTypeHandler *)this)->flags & 0x20) != 0) {
        propertyId = DynamicTypeHandler::TMapKey_GetPropertyId(scriptContext,propertyKey);
        ScriptContext::InvalidateStoreFieldCaches(scriptContext,propertyId);
        PrototypeChainCache<Js::OnlyWritablePropertyCache>::Clear
                  ((PrototypeChainCache<Js::OnlyWritablePropertyCache> *)pPVar3);
      }
    }
  }
  return;
}

Assistant:

void SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::Add(
        TPropertyIndex propertyIndex,
        TPropertyKey propertyKey,
        PropertyAttributes attributes,
        bool isInitialized, bool isFixed, bool usedAsFixed,
        ScriptContext *const scriptContext)
    {
        JavascriptLibrary* library = scriptContext->GetLibrary();
        //
        // For a function with same named parameters,
        // property id Constants::NoProperty will be passed for all the dups except the last one
        // We need to allocate space for dups, but don't add those to map
        if (propertyKey != NULL)
        {
            SimpleDictionaryPropertyDescriptor<TPropertyIndex> descriptor(propertyIndex, attributes);
            Assert((!isFixed && !usedAsFixed) || (!TPropertyKey_IsInternalPropertyId(propertyKey) && this->singletonInstance != nullptr));
            if (TPropertyKey_IsInternalPropertyId(propertyKey) || TMapKey_IsSymbol(propertyKey, scriptContext))
            {
                Assert(!TMapKey_IsJavascriptString<TMapKey>());
                hasNamelessPropertyId = true;
            }
#if ENABLE_FIXED_FIELDS
            descriptor.isInitialized = isInitialized;
            descriptor.isFixed = isFixed;
            descriptor.usedAsFixed = usedAsFixed;
#endif
            propertyMap->Add(TMapKey_ConvertKey<TMapKey>(scriptContext, propertyKey), descriptor);

            library->GetTypesWithNoSpecialPropertyProtoChainCache()->ProcessProperty(this, attributes, propertyKey, scriptContext);
            library->GetTypesWithOnlyWritablePropertyProtoChainCache()->ProcessProperty(this, attributes, propertyKey, scriptContext);
        }
    }